

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_oneof.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::objectivec::OneofGenerator::OneofGenerator
          (OneofGenerator *this,OneofDescriptor *descriptor)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  bool bVar2;
  mapped_type *pmVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  OneofDescriptor *in_RDX;
  OneofDescriptor *descriptor_00;
  OneofDescriptor *descriptor_01;
  AlphaNum *a;
  Descriptor *descriptor_02;
  allocator local_c1;
  string comments;
  key_type local_a0;
  SourceLocation location;
  
  this->descriptor_ = descriptor;
  this_00 = &this->variables_;
  p_Var1 = &(this->variables_)._M_t._M_impl.super__Rb_tree_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->variables_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  OneofEnumName_abi_cxx11_((string *)&location,(objectivec *)descriptor,in_RDX);
  std::__cxx11::string::string((string *)&comments,"enum_name",(allocator *)&local_a0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&comments);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&location);
  std::__cxx11::string::~string((string *)&comments);
  std::__cxx11::string::~string((string *)&location);
  OneofName_abi_cxx11_((string *)&location,(objectivec *)this->descriptor_,descriptor_00);
  std::__cxx11::string::string((string *)&comments,"name",(allocator *)&local_a0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&comments);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&location);
  std::__cxx11::string::~string((string *)&comments);
  std::__cxx11::string::~string((string *)&location);
  OneofNameCapitalized_abi_cxx11_((string *)&location,(objectivec *)this->descriptor_,descriptor_01)
  ;
  std::__cxx11::string::string((string *)&comments,"capitalized_name",(allocator *)&local_a0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&comments);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&location);
  std::__cxx11::string::~string((string *)&comments);
  std::__cxx11::string::~string((string *)&location);
  strings::AlphaNum::AlphaNum
            ((AlphaNum *)&location,
             (int)(((long)this->descriptor_ - *(long *)(*(long *)(this->descriptor_ + 0x10) + 0x30))
                  / 0x28));
  StrCat_abi_cxx11_(&comments,(protobuf *)&location,a);
  std::__cxx11::string::string((string *)&local_a0,"raw_index",&local_c1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_a0);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&comments);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&comments);
  ClassName_abi_cxx11_((string *)&location,*(objectivec **)(this->descriptor_ + 0x10),descriptor_02)
  ;
  std::__cxx11::string::string((string *)&comments,"owning_message_class",(allocator *)&local_a0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&comments);
  std::__cxx11::string::operator=((string *)pmVar3,(string *)&location);
  std::__cxx11::string::~string((string *)&comments);
  std::__cxx11::string::~string((string *)&location);
  comments._M_dataplus._M_p = (pointer)&comments.field_2;
  comments._M_string_length = 0;
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  paVar4 = &location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  comments.field_2._M_local_buf[0] = '\0';
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  location.trailing_comments._M_dataplus._M_p = (pointer)paVar4;
  bVar2 = OneofDescriptor::GetSourceLocation(this->descriptor_,&location);
  if (bVar2) {
    BuildCommentsString_abi_cxx11_
              (&local_a0,(objectivec *)&location,(SourceLocation *)0x1,SUB81(paVar4,0));
    std::__cxx11::string::operator=((string *)&comments,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    std::__cxx11::string::assign((char *)&comments);
  }
  std::__cxx11::string::string((string *)&local_a0,"comments",&local_c1);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_00,&local_a0);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  std::__cxx11::string::~string((string *)&local_a0);
  SourceLocation::~SourceLocation(&location);
  std::__cxx11::string::~string((string *)&comments);
  return;
}

Assistant:

OneofGenerator::OneofGenerator(const OneofDescriptor* descriptor)
    : descriptor_(descriptor) {
  variables_["enum_name"] = OneofEnumName(descriptor_);
  variables_["name"] = OneofName(descriptor_);
  variables_["capitalized_name"] = OneofNameCapitalized(descriptor_);
  variables_["raw_index"] = StrCat(descriptor_->index());
  const Descriptor* msg_descriptor = descriptor_->containing_type();
  variables_["owning_message_class"] = ClassName(msg_descriptor);

  std::string comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    comments = BuildCommentsString(location, true);
  } else {
    comments = "";
  }
  variables_["comments"] = comments;
}